

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaBlockMetadata_TLSF::InsertFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = block->size;
  lVar2 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  bVar3 = 0x38 - ((byte)lVar2 ^ 0x3f);
  if (uVar1 < 0x101) {
    bVar3 = 0;
  }
  if (bVar3 == 0) {
    if ((this->super_VmaBlockMetadata).m_IsVirtual == true) {
      uVar6 = (int)uVar1 - 1U >> 3;
    }
    else {
      uVar6 = (int)uVar1 - 1U >> 6;
    }
  }
  else {
    uVar6 = (uint)(uVar1 >> (bVar3 + 2 & 0x3f)) ^ 0x20;
  }
  if (bVar3 == 0) {
    uVar5 = uVar6 & 0xffff;
  }
  else {
    iVar4 = (uint)bVar3 * 0x20;
    uVar5 = (iVar4 + (uVar6 & 0xffff)) - 0x1c;
    if ((this->super_VmaBlockMetadata).m_IsVirtual != false) {
      uVar5 = iVar4 + (uVar6 & 0xffff);
    }
  }
  block->prevFree = (Block *)0x0;
  block->field_5 = *(anon_union_8_2_34c73d97_for_Block_5 *)(this->m_FreeList + uVar5);
  this->m_FreeList[uVar5] = block;
  if ((block->field_5).nextFree == (Block *)0x0) {
    this->m_InnerIsFreeBitmap[(uint)bVar3] =
         this->m_InnerIsFreeBitmap[(uint)bVar3] | 1 << ((byte)uVar6 & 0x1f);
    this->m_IsFreeBitmap = this->m_IsFreeBitmap | (uint)(1L << (bVar3 & 0x3f));
  }
  else {
    ((block->field_5).nextFree)->prevFree = block;
  }
  this->m_BlocksFreeCount = this->m_BlocksFreeCount + 1;
  this->m_BlocksFreeSize = uVar1 + this->m_BlocksFreeSize;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::InsertFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(!block->IsFree() && "Cannot insert block twice!");

    uint8_t memClass = SizeToMemoryClass(block->size);
    uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
    uint32_t index = GetListIndex(memClass, secondIndex);
    VMA_ASSERT(index < m_ListsCount);
    block->PrevFree() = VMA_NULL;
    block->NextFree() = m_FreeList[index];
    m_FreeList[index] = block;
    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block;
    else
    {
        m_InnerIsFreeBitmap[memClass] |= 1U << secondIndex;
        m_IsFreeBitmap |= 1UL << memClass;
    }
    ++m_BlocksFreeCount;
    m_BlocksFreeSize += block->size;
}